

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# red_black_tree.hpp
# Opt level: O1

void __thiscall
nestl::impl::detail::
rb_tree<int,_int,_nestl::impl::detail::identity<int>,_std::less<int>,_nestl::test::allocator_with_state<int>_>
::rb_tree(rb_tree<int,_int,_nestl::impl::detail::identity<int>,_std::less<int>,_nestl::test::allocator_with_state<int>_>
          *this,rb_tree<int,_int,_nestl::impl::detail::identity<int>,_std::less<int>,_nestl::test::allocator_with_state<int>_>
                *x)

{
  rb_tree_node_base *prVar1;
  base_ptr prVar2;
  
  shared_ptr<nestl::impl::set<void_*,_std::less<void_*>,_nestl::allocator<void_*>_>_>::shared_ptr
            ((shared_ptr<nestl::impl::set<void_*,_std::less<void_*>,_nestl::allocator<void_*>_>_> *)
             this,(shared_ptr<nestl::impl::set<void_*,_std::less<void_*>,_nestl::allocator<void_*>_>_>
                   *)x);
  prVar1 = &(this->m_impl).m_header;
  (this->m_impl).m_header.m_left = (base_ptr)0x0;
  (this->m_impl).m_header.m_right = (base_ptr)0x0;
  *(undefined8 *)&(this->m_impl).m_header = 0;
  (this->m_impl).m_header.m_parent = (base_ptr)0x0;
  (this->m_impl).m_node_count = 0;
  (this->m_impl).m_header.m_left = prVar1;
  (this->m_impl).m_header.m_right = prVar1;
  prVar2 = (x->m_impl).m_header.m_parent;
  if (prVar2 != (base_ptr)0x0) {
    (this->m_impl).m_header.m_parent = prVar2;
    (this->m_impl).m_header.m_left = (x->m_impl).m_header.m_left;
    (this->m_impl).m_header.m_right = (x->m_impl).m_header.m_right;
    prVar2->m_parent = prVar1;
    (x->m_impl).m_header.m_parent = (base_ptr)0x0;
    prVar1 = &(x->m_impl).m_header;
    (x->m_impl).m_header.m_left = prVar1;
    (x->m_impl).m_header.m_right = prVar1;
    (this->m_impl).m_node_count = (x->m_impl).m_node_count;
    (x->m_impl).m_node_count = 0;
  }
  return;
}

Assistant:

rb_tree(rb_tree&& x) NESTL_NOEXCEPT_SPEC
        : m_impl(x.m_impl.m_key_compare, x.m_get_node_allocator())
    {
        if (x.m_root() != 0)
        {
			m_move_data(x, std::true_type());
        }
    }